

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * getLinkedTargetsContent<cmLinkItem>
                   (string *__return_storage_ptr__,
                   vector<cmLinkItem,_std::allocator<cmLinkItem>_> *libraries,
                   cmGeneratorTarget *target,cmGeneratorTarget *headTarget,
                   cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker
                   ,string *interfacePropertyName)

{
  cmGeneratorExpressionContext *context_00;
  cmGeneratorTarget *headTarget_00;
  string *psVar1;
  long *plVar2;
  pointer pcVar3;
  cmLocalGenerator *lg;
  long *plVar4;
  size_type *psVar5;
  pointer pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string sep;
  string depString;
  string local_140;
  string *local_120;
  long *local_118 [2];
  long local_108 [2];
  undefined1 *local_f8;
  char *local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  cmGeneratorExpressionContext *local_50;
  cmGeneratorTarget *local_48;
  cmGeneratorExpressionDAGChecker *local_40;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_38;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_f8 = &local_e8;
  local_f0 = (char *)0x0;
  local_e8 = 0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  pcVar6 = (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_40 = dagChecker;
  local_38 = libraries;
  if (pcVar6 != pcVar3) {
    local_120 = __return_storage_ptr__;
    local_50 = context;
    local_48 = headTarget;
    do {
      if (pcVar6->Target != target && pcVar6->Target != (cmGeneratorTarget *)0x0) {
        local_118[0] = local_108;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,local_f8,local_f0 + (long)local_f8);
        std::__cxx11::string::append((char *)local_118);
        psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar6->Target);
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_118,(ulong)(psVar1->_M_dataplus)._M_p);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_c8 = *plVar4;
          lStack_c0 = plVar2[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *plVar4;
          local_d8 = (long *)*plVar2;
        }
        local_d0 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_d8);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_a8 = *plVar4;
          lStack_a0 = plVar2[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar4;
          local_b8 = (long *)*plVar2;
        }
        local_b0 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_b8,
                                    (ulong)(interfacePropertyName->_M_dataplus)._M_p);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_88 = *plVar4;
          lStack_80 = plVar2[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar4;
          local_98 = (long *)*plVar2;
        }
        local_90 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        psVar5 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_140.field_2._M_allocated_capacity = *psVar5;
          local_140.field_2._8_8_ = plVar2[3];
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar5;
          local_140._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_140._M_string_length = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_118[0] != local_108) {
          operator_delete(local_118[0],local_108[0] + 1);
        }
        std::__cxx11::string::_M_replace((ulong)&local_f8,0,local_f0,0x631692);
        pcVar3 = (local_38->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      headTarget_00 = local_48;
      context_00 = local_50;
      __return_storage_ptr__ = local_120;
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != pcVar3);
    if (local_78._M_string_length != 0) {
      lg = cmGeneratorTarget::GetLocalGenerator(target);
      cmGeneratorExpressionNode::EvaluateDependentExpression
                (&local_140,&local_78,lg,context_00,headTarget_00,target,local_40);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
    }
  }
  cmGeneratorExpression::StripEmptyListElements(&local_140,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getLinkedTargetsContent(
  std::vector<T> const& libraries, cmGeneratorTarget const* target,
  cmGeneratorTarget const* headTarget, cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  const std::string& interfacePropertyName)
{
  std::string linkedTargetsContent;
  std::string sep;
  std::string depString;
  for (typename std::vector<T>::const_iterator it = libraries.begin();
       it != libraries.end(); ++it) {
    // Broken code can have a target in its own link interface.
    // Don't follow such link interface entries so as not to create a
    // self-referencing loop.
    if (it->Target && it->Target != target) {
      depString += sep + "$<TARGET_PROPERTY:" + it->Target->GetName() + "," +
        interfacePropertyName + ">";
      sep = ";";
    }
  }
  if (!depString.empty()) {
    linkedTargetsContent =
      cmGeneratorExpressionNode::EvaluateDependentExpression(
        depString, target->GetLocalGenerator(), context, headTarget, target,
        dagChecker);
  }
  linkedTargetsContent =
    cmGeneratorExpression::StripEmptyListElements(linkedTargetsContent);
  return linkedTargetsContent;
}